

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

void __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
create_two_new_data_nodes
          (Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
           *this,data_node_type *old_node,model_node_type *parent,int duplication_factor,
          bool reuse_model,int start_bucketID)

{
  double dVar1;
  undefined1 auVar2 [16];
  int iVar3;
  self_type *psVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int pos;
  int iVar8;
  data_node_type *pdVar9;
  data_node_type *pdVar10;
  uint8_t uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double local_38;
  
  if (duplication_factor < 1) {
    __assert_fail("duplication_factor >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                  ,0x69d,
                  "void alex::Alex<double, double>::create_two_new_data_nodes(data_node_type *, model_node_type *, int, bool, int) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                 );
  }
  dVar1 = (parent->super_AlexNode<double,_double>).model_.b_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar1;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = old_node->max_key_;
  iVar12 = 1 << (duplication_factor & 0x1fU);
  iVar5 = iVar12 + start_bucketID;
  iVar15 = iVar12 / 2 + start_bucketID;
  dVar16 = (double)old_node->num_right_out_of_bounds_inserts_ / (double)old_node->num_inserts_;
  local_38 = (parent->super_AlexNode<double,_double>).model_.a_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_38;
  uVar14 = parent->num_children_ - 1;
  auVar23 = vfmadd213sd_fma(auVar23,auVar17,auVar22);
  dVar19 = (double)old_node->num_left_out_of_bounds_inserts_ / (double)old_node->num_inserts_;
  uVar6 = ~((int)auVar23._0_8_ >> 0x1f) & (int)auVar23._0_8_;
  if ((int)uVar14 < (int)uVar6) {
    uVar6 = uVar14;
  }
  auVar20._8_8_ = 0;
  auVar20._0_8_ = old_node->min_key_;
  auVar23 = vfmadd213sd_fma(auVar20,auVar17,auVar22);
  uVar7 = ~((int)auVar23._0_8_ >> 0x1f) & (int)auVar23._0_8_;
  if ((int)uVar7 <= (int)uVar14) {
    uVar14 = uVar7;
  }
  local_38 = ((double)iVar15 - dVar1) / local_38;
  pos = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
        ::lower_bound<double>(old_node,&local_38);
  if (pos < old_node->data_capacity_) {
    do {
      dVar1 = old_node->key_slots_[pos];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar1;
      if (((dVar1 == 1.79769313486232e+308) && (!NAN(dVar1))) ||
         (auVar21._8_8_ = 0, auVar21._0_8_ = (parent->super_AlexNode<double,_double>).model_.a_,
         auVar2._8_8_ = 0, auVar2._0_8_ = (parent->super_AlexNode<double,_double>).model_.b_,
         auVar23 = vfmadd213sd_fma(auVar18,auVar21,auVar2), iVar15 <= (int)auVar23._0_8_)) break;
      iVar8 = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
              ::get_next_filled_position(old_node,pos,false);
      iVar3 = old_node->data_capacity_;
      iVar8 = iVar8 + 1;
      pos = iVar8;
      if (iVar3 < iVar8) {
        pos = iVar3;
      }
    } while (iVar8 < iVar3);
  }
  pdVar9 = bulk_load_leaf_node_from_existing
                     (this,old_node,0,pos,true,(FTNode *)0x0,reuse_model,
                      (start_bucketID <= (int)uVar6 && (int)uVar6 < iVar15) && 0.9 < dVar16,
                      (start_bucketID <= (int)uVar14 && (int)uVar14 < iVar15) && 0.9 < dVar19);
  pdVar10 = bulk_load_leaf_node_from_existing
                      (this,old_node,pos,old_node->data_capacity_,true,(FTNode *)0x0,reuse_model,
                       (bool)(~(dVar16 <= 0.9 || (int)uVar6 < iVar15) & (int)uVar6 < iVar5),
                       (bool)(~(dVar19 <= 0.9 || (int)uVar14 < iVar15) & (int)uVar14 < iVar5));
  (pdVar9->super_AlexNode<double,_double>).level_ =
       (parent->super_AlexNode<double,_double>).level_ + 1;
  (pdVar10->super_AlexNode<double,_double>).level_ =
       (parent->super_AlexNode<double,_double>).level_ + 1;
  uVar11 = (char)duplication_factor + 0xff;
  (pdVar9->super_AlexNode<double,_double>).duplication_factor_ = uVar11;
  (pdVar10->super_AlexNode<double,_double>).duplication_factor_ = uVar11;
  if (1 < iVar12) {
    lVar13 = (long)start_bucketID;
    do {
      parent->children_[lVar13] = &pdVar9->super_AlexNode<double,_double>;
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar15);
  }
  if (duplication_factor != 0x1f) {
    lVar13 = (long)iVar15;
    do {
      parent->children_[lVar13] = &pdVar10->super_AlexNode<double,_double>;
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar5);
  }
  psVar4 = old_node->prev_leaf_;
  if (psVar4 != (self_type *)0x0) {
    psVar4->next_leaf_ = pdVar9;
  }
  pdVar9->prev_leaf_ = psVar4;
  pdVar9->next_leaf_ = pdVar10;
  pdVar10->prev_leaf_ = pdVar9;
  psVar4 = old_node->next_leaf_;
  pdVar10->next_leaf_ = psVar4;
  if (psVar4 != (self_type *)0x0) {
    psVar4->prev_leaf_ = pdVar10;
  }
  return;
}

Assistant:

void create_two_new_data_nodes(data_node_type* old_node,
                                 model_node_type* parent,
                                 int duplication_factor, bool reuse_model,
                                 int start_bucketID = 0) {
    assert(duplication_factor >= 1);
    int num_buckets = 1 << duplication_factor;
    int end_bucketID = start_bucketID + num_buckets;
    int mid_bucketID = start_bucketID + num_buckets / 2;

    bool append_mostly_right = old_node->is_append_mostly_right();
    int appending_right_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->max_key_), 0),
        parent->num_children_ - 1);
    bool append_mostly_left = old_node->is_append_mostly_left();
    int appending_left_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->min_key_), 0),
        parent->num_children_ - 1);

    int right_boundary = old_node->lower_bound(
        (mid_bucketID - parent->model_.b_) / parent->model_.a_);
    // Account for off-by-one errors due to floating-point precision issues.
    while (right_boundary < old_node->data_capacity_ &&
           old_node->get_key(right_boundary) != data_node_type::kEndSentinel_ &&
           parent->model_.predict(old_node->get_key(right_boundary)) <
               mid_bucketID) {
      right_boundary = std::min(
          old_node->get_next_filled_position(right_boundary, false) + 1,
          old_node->data_capacity_);
    }
    data_node_type* left_leaf = bulk_load_leaf_node_from_existing(
        old_node, 0, right_boundary, true, nullptr, reuse_model,
        append_mostly_right && start_bucketID <= appending_right_bucketID &&
            appending_right_bucketID < mid_bucketID,
        append_mostly_left && start_bucketID <= appending_left_bucketID &&
            appending_left_bucketID < mid_bucketID);
    data_node_type* right_leaf = bulk_load_leaf_node_from_existing(
        old_node, right_boundary, old_node->data_capacity_, true, nullptr,
        reuse_model,
        append_mostly_right && mid_bucketID <= appending_right_bucketID &&
            appending_right_bucketID < end_bucketID,
        append_mostly_left && mid_bucketID <= appending_left_bucketID &&
            appending_left_bucketID < end_bucketID);
    left_leaf->level_ = static_cast<short>(parent->level_ + 1);
    right_leaf->level_ = static_cast<short>(parent->level_ + 1);
    left_leaf->duplication_factor_ =
        static_cast<uint8_t>(duplication_factor - 1);
    right_leaf->duplication_factor_ =
        static_cast<uint8_t>(duplication_factor - 1);

    for (int i = start_bucketID; i < mid_bucketID; i++) {
      parent->children_[i] = left_leaf;
    }
    for (int i = mid_bucketID; i < end_bucketID; i++) {
      parent->children_[i] = right_leaf;
    }
    link_data_nodes(old_node, left_leaf, right_leaf);
  }